

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O0

int32 stat_retry(char *file,stat *statbuf)

{
  int iVar1;
  int local_24;
  int32 i;
  stat *statbuf_local;
  char *file_local;
  
  local_24 = 0;
  while( true ) {
    if (9 < local_24) {
      return -1;
    }
    iVar1 = stat(file,(stat *)statbuf);
    if (iVar1 == 0) break;
    if (local_24 == 0) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/pio.c"
                     ,0x1fc,"Failed to stat file \'%s\'; retrying...",file);
    }
    sleep(1);
    local_24 = local_24 + 1;
  }
  return 0;
}

Assistant:

int32
stat_retry(const char *file, struct stat * statbuf)
{
    int32 i;

    for (i = 0; i < STAT_RETRY_COUNT; i++) {
#ifndef HAVE_SYS_STAT_H
	FILE *fp;

	if ((fp = (FILE *)fopen(file, "r")) != 0) {
	    fseek(fp, 0, SEEK_END);
	    statbuf->st_size = ftell(fp);
	    fclose(fp);
	    return 0;
	}
#else /* HAVE_SYS_STAT_H */
        if (stat(file, statbuf) == 0)
            return 0;
#endif
        if (i == 0) {
            E_ERROR_SYSTEM("Failed to stat file '%s'; retrying...", file);
        }
#ifdef HAVE_UNISTD_H
        sleep(1);
#endif
    }

    return -1;
}